

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaQbf.c
# Opt level: O0

Vec_Int_t *
Gia_Gen2CreateMuxes(Gia_Man_t *pNew,int nLutSize,int nLutNum,Vec_Int_t *vPLits,Vec_Int_t *vXLits)

{
  int iVar1;
  Vec_Int_t *p;
  int *pCtrl;
  int local_34;
  int iMux;
  int i;
  Vec_Int_t *vLits;
  Vec_Int_t *vXLits_local;
  Vec_Int_t *vPLits_local;
  int nLutNum_local;
  int nLutSize_local;
  Gia_Man_t *pNew_local;
  
  p = Vec_IntAlloc(nLutNum);
  iVar1 = Vec_IntSize(vPLits);
  if (iVar1 != nLutNum * (1 << ((byte)nLutSize & 0x1f))) {
    __assert_fail("Vec_IntSize(vPLits) == nLutNum * (1 << nLutSize)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaQbf.c"
                  ,0xd6,
                  "Vec_Int_t *Gia_Gen2CreateMuxes(Gia_Man_t *, int, int, Vec_Int_t *, Vec_Int_t *)")
    ;
  }
  iVar1 = Vec_IntSize(vXLits);
  if (iVar1 == nLutSize) {
    for (local_34 = 0; local_34 < nLutNum; local_34 = local_34 + 1) {
      pCtrl = Vec_IntArray(vXLits);
      iVar1 = Gia_Gen2CreateMux_rec
                        (pNew,pCtrl,nLutSize,vPLits,local_34 * (1 << ((byte)nLutSize & 0x1f)));
      Vec_IntPush(p,iVar1);
    }
    return p;
  }
  __assert_fail("Vec_IntSize(vXLits) == nLutSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaQbf.c"
                ,0xd7,
                "Vec_Int_t *Gia_Gen2CreateMuxes(Gia_Man_t *, int, int, Vec_Int_t *, Vec_Int_t *)");
}

Assistant:

Vec_Int_t * Gia_Gen2CreateMuxes( Gia_Man_t * pNew, int nLutSize, int nLutNum, Vec_Int_t * vPLits, Vec_Int_t * vXLits )
{
    Vec_Int_t * vLits = Vec_IntAlloc( nLutNum );
    int i, iMux;
    // add MUXes for each group of flops
    assert( Vec_IntSize(vPLits) == nLutNum * (1 << nLutSize) );
    assert( Vec_IntSize(vXLits) == nLutSize );
    for ( i = 0; i < nLutNum; i++ )
    {
        iMux = Gia_Gen2CreateMux_rec( pNew, Vec_IntArray(vXLits), nLutSize, vPLits, i * (1 << nLutSize) );
        Vec_IntPush( vLits, iMux );
    }
    return vLits;
}